

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::ServiceDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ServiceDescriptor *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  DebugString(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ServiceDescriptor::DebugString() const {
  string contents;
  DebugString(&contents);
  return contents;
}